

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_FilterVoice
               (FAudio *audio,FAudioFilterParameters *filter,FAudioFilterState *filterState,
               float *samples,uint32_t numSamples,uint16_t numChannels)

{
  uint32_t ci;
  uint32_t j;
  uint16_t numChannels_local;
  uint32_t numSamples_local;
  float *samples_local;
  FAudioFilterState *filterState_local;
  FAudioFilterParameters *filter_local;
  FAudio *audio_local;
  
  for (j = 0; j < numSamples; j = j + 1) {
    for (ci = 0; ci < numChannels; ci = ci + 1) {
      filterState[ci][0] = filter->Frequency * filterState[ci][1] + filterState[ci][0];
      filterState[ci][2] =
           -filter->OneOverQ * filterState[ci][1] +
           (samples[j * numChannels + ci] - filterState[ci][0]);
      filterState[ci][1] = filter->Frequency * filterState[ci][2] + filterState[ci][1];
      filterState[ci][3] = filterState[ci][2] + filterState[ci][0];
      samples[j * numChannels + ci] = filterState[ci][filter->Type];
    }
  }
  return;
}

Assistant:

static inline void FAudio_INTERNAL_FilterVoice(
	FAudio *audio,
	const FAudioFilterParameters *filter,
	FAudioFilterState *filterState,
	float *samples,
	uint32_t numSamples,
	uint16_t numChannels
) {
	uint32_t j, ci;

	LOG_FUNC_ENTER(audio)

	/* Apply a digital state-variable filter to the voice.
	 * The difference equations of the filter are:
	 *
	 * Yl(n) = F Yb(n - 1) + Yl(n - 1)
	 * Yh(n) = x(n) - Yl(n) - OneOverQ Yb(n - 1)
	 * Yb(n) = F Yh(n) + Yb(n - 1)
	 * Yn(n) = Yl(n) + Yh(n)
	 *
	 * Please note that FAudioFilterParameters.Frequency is defined as:
	 *
	 * (2 * sin(pi * (desired filter cutoff frequency) / sampleRate))
	 *
	 * - @JohanSmet
	 */

	for (j = 0; j < numSamples; j += 1)
	for (ci = 0; ci < numChannels; ci += 1)
	{
		filterState[ci][FAudioLowPassFilter] = filterState[ci][FAudioLowPassFilter] + (filter->Frequency * filterState[ci][FAudioBandPassFilter]);
		filterState[ci][FAudioHighPassFilter] = samples[j * numChannels + ci] - filterState[ci][FAudioLowPassFilter] - (filter->OneOverQ * filterState[ci][FAudioBandPassFilter]);
		filterState[ci][FAudioBandPassFilter] = (filter->Frequency * filterState[ci][FAudioHighPassFilter]) + filterState[ci][FAudioBandPassFilter];
		filterState[ci][FAudioNotchFilter] = filterState[ci][FAudioHighPassFilter] + filterState[ci][FAudioLowPassFilter];
		samples[j * numChannels + ci] = filterState[ci][filter->Type];
	}

	LOG_FUNC_EXIT(audio)
}